

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.cpp
# Opt level: O2

void testStartWriteUTF8(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  undefined8 extraout_RAX;
  exr_encode_pipeline_t *func;
  int c;
  long lVar4;
  char *expr;
  int partidx;
  exr_context_t outf;
  uint16_t hval [2];
  string outfn;
  exr_attr_box2i_t dataW;
  undefined1 local_2b8 [104];
  exr_chunk_info_t cinfo;
  exr_encode_pipeline_t encoder;
  
  std::operator+(&outfn,tempdir,anon_var_dwarf_6d81c);
  local_2b8._80_8_ = 0;
  local_2b8._64_8_ = 0;
  local_2b8._72_8_ = 0;
  local_2b8._48_4_ = 0;
  local_2b8[0x34] = '\0';
  local_2b8[0x35] = '\0';
  local_2b8[0x36] = '\0';
  local_2b8[0x37] = '\0';
  local_2b8._56_8_ = 0;
  local_2b8._32_4_ = 0;
  local_2b8._36_4_ = 0;
  local_2b8._40_4_ = 0;
  local_2b8._44_4_ = 0;
  local_2b8._16_2_ = 0;
  local_2b8._18_2_ = 0;
  local_2b8._20_4_ = 0;
  local_2b8._24_8_ = (exr_const_context_t_conflict)0x0;
  local_2b8._0_8_ = 0x68;
  local_2b8._8_8_ = err_cb;
  local_2b8._88_8_ = 0xbf80000000000003;
  local_2b8._96_8_ = (void *)0x8;
  exr_set_default_zip_compression_level(0xffffffffffffffff);
  func = (exr_encode_pipeline_t *)local_2b8;
  iVar1 = exr_start_write(&outf,outfn._M_dataplus._M_p,0);
  if (iVar1 == 0) {
    func = (exr_encode_pipeline_t *)&partidx;
    iVar1 = exr_add_part(outf,"beauty",0);
    if (iVar1 != 0) goto LAB_0015359c;
    if (partidx != 0) goto LAB_001535fd;
    iVar1 = exr_get_count(outf,&partidx);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,") ");
      pcVar3 = (char *)exr_get_default_error_message(iVar1);
      poVar2 = std::operator<<(poVar2,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      core_test_fail("exr_get_count (outf, &partidx)",(char *)0x59c,0x327e27,(char *)func);
LAB_0015366c:
      pcVar3 = (char *)0x59d;
      expr = "partidx == 1";
      goto LAB_00153678;
    }
    if (partidx != 1) goto LAB_0015366c;
    partidx = 0;
    dataW.min.x = 0;
    dataW.min.y = 0;
    dataW.max.x = 0;
    dataW.max.y = 0;
    func = (exr_encode_pipeline_t *)0x1;
    iVar1 = exr_initialize_required_attr_simple(outf,0,1,1,0);
    if (iVar1 != 0) goto LAB_00153684;
    iVar1 = exr_set_data_window(outf,partidx,&dataW);
    if (iVar1 != 0) goto LAB_001536e5;
    func = (exr_encode_pipeline_t *)0x1;
    iVar1 = exr_add_channel(outf,partidx,"h",1,0,1,1);
    if (iVar1 != 0) goto LAB_00153746;
    iVar1 = exr_write_header(outf);
    if (iVar1 != 0) goto LAB_001537a7;
    func = (exr_encode_pipeline_t *)&cinfo;
    iVar1 = exr_write_scanline_chunk_info(outf,0,0);
    if (iVar1 != 0) goto LAB_00153808;
    func = &encoder;
    iVar1 = exr_encoding_initialize(outf,0,&cinfo);
    if (iVar1 != 0) goto LAB_00153869;
    hval[0] = 0x1234;
    hval[1] = 0;
    func = (exr_encode_pipeline_t *)0x0;
    for (lVar4 = 0; lVar4 < encoder.channel_count; lVar4 = lVar4 + 1) {
      *(uint16_t **)((long)&(encoder.channels)->field_12 + (long)func) = hval;
      pcVar3 = (char *)((long)&(encoder.channels)->user_pixel_stride + (long)func);
      pcVar3[0] = '\x02';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\x02';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      func = (exr_encode_pipeline_t *)&(func->chunk).width;
    }
    iVar1 = exr_encoding_choose_default_routines(outf,0,&encoder);
    if (iVar1 != 0) goto LAB_001538ca;
    iVar1 = exr_encoding_run(outf,0,&encoder);
    if (iVar1 != 0) goto LAB_0015392b;
    iVar1 = exr_encoding_destroy(outf);
    if (iVar1 != 0) goto LAB_0015398c;
    iVar1 = exr_finish(&outf);
    if (iVar1 == 0) {
      iVar1 = access(outfn._M_dataplus._M_p,0);
      if (iVar1 != -1) {
        remove(outfn._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&outfn);
        return;
      }
      goto LAB_00153a4e;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_start_write ( &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x598,0x327e27,(char *)func);
LAB_0015359c:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_add_part (outf, \"beauty\", EXR_STORAGE_SCANLINE, &partidx)",(char *)0x59a,
                   0x327e27,(char *)func);
LAB_001535fd:
    pcVar3 = (char *)0x59b;
    expr = "partidx == 0";
LAB_00153678:
    core_test_fail(expr,pcVar3,0x327e27,(char *)func);
LAB_00153684:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_initialize_required_attr_simple (outf, partidx, fw, fh, EXR_COMPRESSION_NONE)"
                   ,(char *)0x5a5,0x327e27,(char *)func);
LAB_001536e5:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_set_data_window (outf, partidx, &dataW)",(char *)0x5a6,0x327e27,(char *)func
                  );
LAB_00153746:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_add_channel ( outf, partidx, \"h\", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1)"
                   ,(char *)0x5a9,0x327e27,(char *)func);
LAB_001537a7:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_write_header (outf)",(char *)0x5aa,0x327e27,(char *)func);
LAB_00153808:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_write_scanline_chunk_info (outf, 0, 0, &cinfo)",(char *)0x5af,0x327e27,
                   (char *)func);
LAB_00153869:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_encoding_initialize (outf, 0, &cinfo, &encoder)",(char *)0x5b1,0x327e27,
                   (char *)func);
LAB_001538ca:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_encoding_choose_default_routines (outf, 0, &encoder)",(char *)0x5bb,0x327e27
                   ,(char *)func);
LAB_0015392b:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_encoding_run (outf, 0, &encoder)",(char *)0x5bc,0x327e27,(char *)func);
LAB_0015398c:
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_encoding_destroy (outf, &encoder)",(char *)0x5bd,0x327e27,(char *)func);
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2,") ");
  pcVar3 = (char *)exr_get_default_error_message(iVar1);
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  core_test_fail("exr_finish (&outf)",(char *)0x5bf,0x327e27,(char *)func);
LAB_00153a4e:
  core_test_fail("access (outfn.c_str (), 0) != -1",(char *)0x5d0,0x327e27,(char *)func);
  std::__cxx11::string::~string((string *)&outfn);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testStartWriteUTF8 (const std::string& tempdir)
{
    exr_context_t outf;
    // per google translate, image in Japanese
    std::string   outfn = tempdir + "画像.exr";
    int           partidx;

    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;
    cinit.zip_level = 3;
    cinit.flags |= EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER;

    exr_set_default_zip_compression_level (-1);

    EXRCORE_TEST_RVAL (exr_start_write (
        &outf, outfn.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    EXRCORE_TEST_RVAL (
        exr_add_part (outf, "beauty", EXR_STORAGE_SCANLINE, &partidx));
    EXRCORE_TEST (partidx == 0);
    EXRCORE_TEST_RVAL (exr_get_count (outf, &partidx));
    EXRCORE_TEST (partidx == 1);
    partidx = 0;

    int fw = 1;
    int fh = 1;
    exr_attr_box2i_t dataW = { {0, 0}, {0, 0} };

    EXRCORE_TEST_RVAL (
        exr_initialize_required_attr_simple (outf, partidx, fw, fh, EXR_COMPRESSION_NONE));
    EXRCORE_TEST_RVAL (exr_set_data_window (outf, partidx, &dataW));

    EXRCORE_TEST_RVAL (exr_add_channel (
        outf, partidx, "h", EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, 1, 1));
    EXRCORE_TEST_RVAL (exr_write_header (outf));

    exr_chunk_info_t      cinfo;
    exr_encode_pipeline_t encoder;

    EXRCORE_TEST_RVAL (exr_write_scanline_chunk_info (outf, 0, 0, &cinfo));
    EXRCORE_TEST_RVAL (
        exr_encoding_initialize (outf, 0, &cinfo, &encoder));

    uint16_t hval[] = { 0x1234, 0 };
    for (int c = 0; c < encoder.channel_count; ++c)
    {
        encoder.channels[c].encode_from_ptr   = (const uint8_t *)hval;
        encoder.channels[c].user_pixel_stride = 2;
        encoder.channels[c].user_line_stride  = 2;
    }
    EXRCORE_TEST_RVAL (
        exr_encoding_choose_default_routines (outf, 0, &encoder));
    EXRCORE_TEST_RVAL (exr_encoding_run (outf, 0, &encoder));
    EXRCORE_TEST_RVAL (exr_encoding_destroy (outf, &encoder));

    EXRCORE_TEST_RVAL (exr_finish (&outf));
#ifdef _WIN32
    int      wcSize = 0, fnlen = 0;
    wchar_t* wcFn = NULL;

    fnlen  = (int) strlen (outfn.c_str ());
    wcSize = MultiByteToWideChar (CP_UTF8, 0, outfn.c_str (), fnlen, NULL, 0);
    wcFn   = (wchar_t*) malloc (sizeof (wchar_t) * (wcSize + 1));
    if (wcFn)
    {
        MultiByteToWideChar (CP_UTF8, 0, outfn.c_str (), fnlen, wcFn, wcSize);
        wcFn[wcSize] = 0;
    }
    EXRCORE_TEST ( _waccess (wcFn, 0) != -1 );
    _wremove (wcFn);
    free (wcFn);
#else
    EXRCORE_TEST ( access (outfn.c_str (), F_OK) != -1 );
    remove (outfn.c_str ());
#endif
}